

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_nex.cpp
# Opt level: O3

void dirNexCfg(void)

{
  bool bVar1;
  aint cfgArgs [4];
  bool optionals [4];
  uint local_18 [5];
  bool local_4 [4];
  
  if (nex.f != (FILE *)0x0) {
    local_18[0] = 0;
    local_18[1] = 0;
    local_18[2] = 0;
    local_18[3] = 0;
    local_4[0] = false;
    local_4[1] = true;
    local_4[2] = true;
    local_4[3] = true;
    bVar1 = getIntArguments<4>(&lp,(aint (*) [4])local_18,&local_4);
    if (bVar1) {
      if ((1 < local_18[3] || 1 < local_18[2]) || (0xfffe < local_18[1] || 7 < local_18[0])) {
        Warning("[SAVENEX] values are not within 0..7,0..65534,0/1,0/1 ranges",(char *)0x0,W_PASS3);
      }
      nex.h.border = (byte)local_18[0] & 7;
      nex.h.fileHandleCfg = (word)local_18[1];
      nex.h.preserveNextRegs = (byte)local_18[2];
      nex.h.ramReq = (byte)local_18[3];
    }
    else {
      Error("[SAVENEX] expected syntax is CFG <border 0..7>[,<fileHandle 0/1/$4000+>[,<PreserveNextRegs 0/1>[,<2MbRamReq 0/1>]]]"
            ,bp,SUPPRESS);
    }
    return;
  }
  Error("[SAVENEX] NEX file is not open",(char *)0x0,SUPPRESS);
  return;
}

Assistant:

static void dirNexCfg() {
// ;; SAVENEX CFG <border 0..7>[,<fileHandle 0/1/$4000+>[,<PreserveNextRegs 0/1>[,<2MbRamReq 0/1>]]]
	if (nullptr == nex.f) {
		Error("[SAVENEX] NEX file is not open", NULL, SUPPRESS);
		return;
	}
	// parse arguments
	aint cfgArgs[4] = {0};
	const bool optionals[] = {false, true, true, true};
	if (!getIntArguments<4>(lp, cfgArgs, optionals)) {
		Error("[SAVENEX] expected syntax is CFG <border 0..7>[,<fileHandle 0/1/$4000+>[,<PreserveNextRegs 0/1>[,<2MbRamReq 0/1>]]]", bp, SUPPRESS);
		return;
	}
	// warn about invalid values
	if (cfgArgs[0] < 0 || 7 < cfgArgs[0] ||
		cfgArgs[1] < 0 || 0xFFFE < cfgArgs[1] ||
		cfgArgs[2] < 0 || 1 < cfgArgs[2] ||
		cfgArgs[3] < 0 || 1 < cfgArgs[3]) Warning("[SAVENEX] values are not within 0..7,0..65534,0/1,0/1 ranges");
	// set the values in header
	nex.h.border = cfgArgs[0] & 7;
	nex.h.fileHandleCfg = cfgArgs[1];
	nex.h.preserveNextRegs = cfgArgs[2];
	nex.h.ramReq = cfgArgs[3];
}